

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

boolean place_level(int proto_index,proto_dungeon *pd)

{
  char cVar1;
  s_level *psVar2;
  boolean bVar3;
  int x;
  int iVar4;
  long lVar5;
  long lVar6;
  s_level *lev;
  long lVar7;
  bool bVar8;
  int start;
  boolean map [33];
  
  while( true ) {
    if (pd->n_levs == proto_index) {
      return '\x01';
    }
    lVar7 = (long)proto_index;
    psVar2 = pd->final_lev[lVar7];
    if (psVar2 != (s_level *)0x0) break;
    proto_index = proto_index + 1;
  }
  for (lVar5 = 0; lVar5 != 0x21; lVar5 = lVar5 + 1) {
    map[lVar5] = '\0';
  }
  x = level_range((psVar2->dlevel).dnum,(int)pd->tmplevel[lVar7].lev.base,
                  (int)pd->tmplevel[lVar7].lev.rand,pd->tmplevel[lVar7].chain,pd,&start);
  lVar5 = (long)start;
  lVar6 = x + lVar5;
  for (; lVar5 < lVar6; lVar5 = lVar5 + 1) {
    map[lVar5] = '\x01';
  }
  for (lVar5 = (long)pd->start; lVar5 < lVar7; lVar5 = lVar5 + 1) {
    if ((pd->final_lev[lVar5] != (s_level *)0x0) &&
       (cVar1 = (pd->final_lev[lVar5]->dlevel).dlevel, map[cVar1] != '\0')) {
      map[cVar1] = '\0';
      x = x + -1;
    }
  }
  while( true ) {
    if (x == 0) {
      return '\0';
    }
    iVar4 = rn2(x);
    lVar7 = 1;
    while( true ) {
      if (lVar7 == 0x21) {
        panic("pick_level:  ran out of valid levels");
      }
      if ((map[lVar7] != '\0') && (bVar8 = iVar4 == 0, iVar4 = iVar4 + -1, bVar8)) break;
      lVar7 = lVar7 + 1;
    }
    (psVar2->dlevel).dlevel = (xchar)lVar7;
    bVar3 = place_level(proto_index + 1,pd);
    if (bVar3 != '\0') break;
    map[(psVar2->dlevel).dlevel] = '\0';
    x = x + -1;
  }
  return '\x01';
}

Assistant:

static boolean place_level(int proto_index, struct proto_dungeon *pd)
{
    boolean map[MAXLEVEL+1];	/* valid levels are 1..MAXLEVEL inclusive */
    s_level *lev;
    int npossible;

    if (proto_index == pd->n_levs) return TRUE;	/* at end of proto levels */

    lev = pd->final_lev[proto_index];

    /* No level created for this prototype, goto next. */
    if (!lev) return place_level(proto_index+1, pd);

    npossible = possible_places(proto_index, map, pd);

    for (; npossible; --npossible) {
	lev->dlevel.dlevel = pick_level(map, rn2(npossible));
	if (place_level(proto_index+1, pd))
	    return TRUE;

	map[lev->dlevel.dlevel] = FALSE;	/* this choice didn't work */
    }
    return FALSE;
}